

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNSISGenerator.cxx
# Opt level: O2

int __thiscall cmCPackNSISGenerator::PackageFiles(cmCPackNSISGenerator *this)

{
  string *psVar1;
  cmCPackLog *pcVar2;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> alt_00;
  undefined1 auVar3 [16];
  size_type sVar4;
  pointer pbVar5;
  bool bVar6;
  byte bVar7;
  string *psVar8;
  string *local;
  size_type __n;
  ostream *poVar9;
  long lVar10;
  const_iterator cVar11;
  cmValue cVar12;
  _Rb_tree_node_base *p_Var13;
  _Base_ptr p_Var14;
  byte bVar15;
  string *file;
  pointer remote;
  uint uVar16;
  pointer ppcVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  _Alloc_hider _Var18;
  bool bVar19;
  string_view name;
  string_view name_00;
  string_view componentName;
  string_view prefix;
  string_view prefix_00;
  basic_string_view<char,_std::char_traits<char>_> componentName_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string_view str_00;
  string_view str_01;
  string local_a10;
  string nsisPreArguments;
  string nsisPostArguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  string installerHeaderImage;
  string nsisCmd;
  string componentDescriptions;
  string output;
  string fileN_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  ostringstream cmCPackLog_msg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_760;
  string local_750 [32];
  string local_730 [552];
  int retVal;
  undefined4 uStack_504;
  size_type local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
  *local_4e8;
  vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_> installTypes;
  string nsisFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  string local_490;
  string defines;
  string installTypesCode;
  string tmpFile;
  string nsisInInstallOptions;
  string nsisInFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  string nsisInstallOptions;
  undefined8 local_390;
  undefined8 uStack_388;
  uint7 uStack_37f;
  undefined8 local_378;
  undefined8 uStack_370;
  uint7 uStack_367;
  string local_360;
  ostringstream dstr;
  pointer local_338;
  string local_1c8;
  ostringstream str;
  
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = (char *)uStack_370;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_378;
  alt.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = (ulong)uStack_367 << 8;
  name._M_str = "NSIS.template.in";
  name._M_len = 0x10;
  cmCPackGenerator::FindTemplate_abi_cxx11_(&nsisInFileName,&this->super_cmCPackGenerator,name,alt);
  if (nsisInFileName._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "CPack error: Could not find NSIS installer template file.");
    std::endl<char,std::char_traits<char>>(poVar9);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x31,_str);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar16 = 0;
    goto LAB_001a020a;
  }
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_str = (char *)uStack_388;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _M_payload._M_value._M_len = local_390;
  alt_00.super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
  _M_payload.super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
  _16_8_ = (ulong)uStack_37f << 8;
  name_00._M_str = "NSIS.InstallOptions.ini.in";
  name_00._M_len = 0x1a;
  cmCPackGenerator::FindTemplate_abi_cxx11_
            (&nsisInInstallOptions,&this->super_cmCPackGenerator,name_00,alt_00);
  if (nsisInInstallOptions._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,
                             "CPack error: Could not find NSIS installer options file.");
    std::endl<char,std::char_traits<char>>(poVar9);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x39,_str);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    uVar16 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_TOPLEVEL_DIRECTORY",(allocator<char> *)&str);
    psVar8 = (string *)
             cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    if (psVar8 == (string *)0x0) {
      psVar8 = &cmValue::Empty_abi_cxx11_;
    }
    std::__cxx11::string::string((string *)&nsisFileName,(string *)psVar8);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    cmStrCat<std::__cxx11::string&,char_const(&)[16]>
              (&tmpFile,&nsisFileName,(char (*) [16])"/NSISOutput.log");
    std::operator+(&nsisInstallOptions,&nsisFileName,"/NSIS.InstallOptions.ini");
    std::__cxx11::string::append((char *)&nsisFileName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
    psVar1 = (this->super_cmCPackGenerator).files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local = &(this->super_cmCPackGenerator).toplevel;
    for (psVar8 = (this->super_cmCPackGenerator).files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar8 != psVar1; psVar8 = psVar8 + 1)
    {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"$INSTDIR",(allocator<char> *)&dstr);
      cmSystemTools::RelativePath((string *)&dstr,local,psVar8);
      if ((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_node_count
          != 0) {
        __n = std::__cxx11::string::find((char)(string *)&dstr,0x2f);
        if (__n == 0xffffffffffffffff) {
          componentName._M_str = _dstr;
          componentName._M_len = (size_t)local_338;
          CustomComponentInstallDirectory_abi_cxx11_(&fileN_1,this,componentName);
        }
        else {
          fileN_1._M_dataplus._M_p = local_338;
          fileN_1._M_string_length = (size_type)_dstr;
          componentName_00 =
               std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)&fileN_1,0,__n);
          CustomComponentInstallDirectory_abi_cxx11_(&fileN_1,this,componentName_00);
        }
        std::__cxx11::string::operator=((string *)&cmCPackLog_msg,(string *)&fileN_1);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::substr((ulong)&fileN_1,(ulong)&dstr);
        std::__cxx11::string::operator=((string *)&dstr,(string *)&fileN_1);
        std::__cxx11::string::~string((string *)&fileN_1);
      }
      fileN_1._M_dataplus._M_p._0_1_ = 0x2f;
      installerHeaderImage._M_dataplus._M_p._0_1_ = 0x5c;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (_dstr,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(local_338 + _dstr),(char *)&fileN_1,(char *)&installerHeaderImage);
      poVar9 = std::operator<<((ostream *)&str,"  Delete \"");
      poVar9 = std::operator<<(poVar9,(string *)&cmCPackLog_msg);
      poVar9 = std::operator<<(poVar9,"\\");
      poVar9 = std::operator<<(poVar9,(string *)&dstr);
      poVar9 = std::operator<<(poVar9,"\"");
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&dstr);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,"Uninstall Files: ");
    std::__cxx11::stringbuf::str();
    poVar9 = std::operator<<(poVar9,(string *)&dstr);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&dstr);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x58,_dstr);
    std::__cxx11::string::~string((string *)&dstr);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_DELETE_FILES",(allocator<char> *)&fileN_1);
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,(string *)&dstr);
    std::__cxx11::string::~string((string *)&dstr);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dirs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetListOfSubdirectories(this,(this->super_cmCPackGenerator).toplevel._M_dataplus._M_p,&dirs);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dstr);
    pbVar5 = dirs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_4e8 = &(this->super_cmCPackGenerator).Components;
    for (remote = dirs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; remote != pbVar5; remote = remote + 1)
    {
      _cmCPackLog_msg = (pointer)&local_760;
      local_760._M_local_buf[0] = '\0';
      cmSystemTools::RelativePath(&fileN_1,local,remote);
      if (fileN_1._M_string_length != 0) {
        if (((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
             _M_node_count != 0) &&
           (lVar10 = std::__cxx11::string::find((char)&fileN_1,0x2f), lVar10 != -1)) {
          std::__cxx11::string::substr((ulong)&installerHeaderImage,(ulong)&fileN_1);
          std::__cxx11::string::operator=((string *)&cmCPackLog_msg,(string *)&installerHeaderImage)
          ;
          std::__cxx11::string::~string((string *)&installerHeaderImage);
          std::__cxx11::string::erase((ulong)&fileN_1,0);
        }
        installerHeaderImage._M_dataplus._M_p._0_1_ = 0x2f;
        nsisPreArguments._M_dataplus._M_p._0_1_ = 0x5c;
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )fileN_1._M_dataplus._M_p,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(fileN_1._M_dataplus._M_p + fileN_1._M_string_length),
                   (char *)&installerHeaderImage,(char *)&nsisPreArguments);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = _cmCPackLog_msg;
        CustomComponentInstallDirectory_abi_cxx11_
                  (&installerHeaderImage,this,(string_view)(auVar3 << 0x40));
        poVar9 = std::operator<<((ostream *)&dstr,"  RMDir \"");
        poVar9 = std::operator<<(poVar9,(string *)&installerHeaderImage);
        poVar9 = std::operator<<(poVar9,"\\");
        poVar9 = std::operator<<(poVar9,(string *)&fileN_1);
        poVar9 = std::operator<<(poVar9,"\"");
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::string::~string((string *)&installerHeaderImage);
      }
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,"Uninstall Dirs: ");
    std::__cxx11::stringbuf::str();
    poVar9 = std::operator<<(poVar9,(string *)&fileN_1);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&fileN_1);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x7c,fileN_1._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&fileN_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_DELETE_DIRECTORIES",
               (allocator<char> *)&installerHeaderImage);
    std::__cxx11::stringbuf::str();
    cmCPackGenerator::SetOptionIfNotSet
              (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,&fileN_1);
    std::__cxx11::string::~string((string *)&fileN_1);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
    poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,"Configure file: ");
    poVar9 = std::operator<<(poVar9,(string *)&nsisInFileName);
    poVar9 = std::operator<<(poVar9," to ");
    poVar9 = std::operator<<(poVar9,(string *)&nsisFileName);
    std::endl<char,std::char_traits<char>>(poVar9);
    pcVar2 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar2,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                    ,0x81,fileN_1._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&fileN_1);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_ICON",
               (allocator<char> *)&installerHeaderImage);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
LAB_0019e2d8:
      _cmCPackLog_msg = (pointer)&local_760;
      local_760._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_MUI_ICON",(allocator<char> *)&installerHeaderImage);
      bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&fileN_1);
      std::__cxx11::string::~string((string *)&fileN_1);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&installerHeaderImage,"CPACK_NSIS_MUI_ICON",
                   (allocator<char> *)&nsisPostArguments);
        nsisPreArguments._M_dataplus._M_p =
             (pointer)cmCPackGenerator::GetOption
                                (&this->super_cmCPackGenerator,&installerHeaderImage);
        cmStrCat<char_const(&)[19],cmValue,char_const(&)[3]>
                  (&fileN_1,(char (*) [19])"!define MUI_ICON \"",(cmValue *)&nsisPreArguments,
                   (char (*) [3])0x702875);
        std::__cxx11::string::append((string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::~string((string *)&installerHeaderImage);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_MUI_UNIICON",
                 (allocator<char> *)&installerHeaderImage);
      bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&fileN_1);
      std::__cxx11::string::~string((string *)&fileN_1);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&installerHeaderImage,"CPACK_NSIS_MUI_UNIICON",
                   (allocator<char> *)&nsisPostArguments);
        nsisPreArguments._M_dataplus._M_p =
             (pointer)cmCPackGenerator::GetOption
                                (&this->super_cmCPackGenerator,&installerHeaderImage);
        cmStrCat<char_const(&)[21],cmValue,char_const(&)[3]>
                  (&fileN_1,(char (*) [21])"!define MUI_UNICON \"",(cmValue *)&nsisPreArguments,
                   (char (*) [3])0x702875);
        std::__cxx11::string::append((string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::~string((string *)&installerHeaderImage);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                 (allocator<char> *)&installerHeaderImage);
      cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&fileN_1,_cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_MUI_UNIICON",(allocator<char> *)&nsisPreArguments);
      bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&fileN_1);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (bVar6) goto LAB_0019e2d8;
    }
    installerHeaderImage._M_dataplus._M_p = (pointer)&installerHeaderImage.field_2;
    installerHeaderImage._M_string_length = 0;
    installerHeaderImage.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_HEADERIMAGE",(allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_HEADERIMAGE",(allocator<char> *)&fileN_1)
      ;
      cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::_M_assign((string *)&installerHeaderImage);
LAB_0019e5f4:
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_ICON",(allocator<char> *)&fileN_1);
      bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_PACKAGE_ICON",(allocator<char> *)&fileN_1);
        cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
        std::__cxx11::string::_M_assign((string *)&installerHeaderImage);
        goto LAB_0019e5f4;
      }
    }
    if (installerHeaderImage._M_string_length != 0) {
      cmStrCat<char_const(&)[33],std::__cxx11::string&,char_const(&)[3]>
                ((string *)&cmCPackLog_msg,(char (*) [33])"!define MUI_HEADERIMAGE_BITMAP \"",
                 &installerHeaderImage,(char (*) [3])0x702875);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_ICON_CODE",
                 (allocator<char> *)&nsisPreArguments);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",
               (allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP",
                 (allocator<char> *)&nsisPostArguments);
      nsisPreArguments._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
      cmStrCat<char_const(&)[39],cmValue,char_const(&)[3]>
                ((string *)&cmCPackLog_msg,(char (*) [39])"!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
                 (cmValue *)&nsisPreArguments,(char (*) [3])0x702875);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                 (allocator<char> *)&nsisPreArguments);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",
               (allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP",
                 (allocator<char> *)&nsisPostArguments);
      nsisPreArguments._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
      cmStrCat<char_const(&)[41],cmValue,char_const(&)[3]>
                ((string *)&cmCPackLog_msg,
                 (char (*) [41])"!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
                 (cmValue *)&nsisPreArguments,(char (*) [3])0x702875);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                 (allocator<char> *)&nsisPreArguments);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MUI_FINISHPAGE_RUN",(allocator<char> *)&fileN_1
              );
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_EXECUTABLES_DIRECTORY",(allocator<char> *)&output);
      nsisPostArguments._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
      componentDescriptions._M_dataplus._M_p._0_1_ = 0x5c;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nsisPreArguments,"CPACK_NSIS_MUI_FINISHPAGE_RUN",
                 (allocator<char> *)&retVal);
      nsisCmd._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&nsisPreArguments);
      cmStrCat<char_const(&)[38],cmValue,char,cmValue,char_const(&)[3]>
                ((string *)&cmCPackLog_msg,(char (*) [38])"!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
                 (cmValue *)&nsisPostArguments,(char *)&componentDescriptions,(cmValue *)&nsisCmd,
                 (char (*) [3])0x702875);
      std::__cxx11::string::~string((string *)&nsisPreArguments);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                 (allocator<char> *)&nsisPreArguments);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_WELCOME_TITLE",(allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_WELCOME_TITLE",(allocator<char> *)&nsisPostArguments
                );
      nsisPreArguments._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
      cmStrCat<char_const(&)[32],cmValue,char_const(&)[2]>
                ((string *)&cmCPackLog_msg,(char (*) [32])"!define MUI_WELCOMEPAGE_TITLE \"",
                 (cmValue *)&nsisPreArguments,(char (*) [2])0x70274e);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE",
                 (allocator<char> *)&nsisPreArguments);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_WELCOME_TITLE_3LINES",
               (allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE",
                 (allocator<char> *)&fileN_1);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,
                 "!define MUI_WELCOMEPAGE_TITLE_3LINES");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_FINISH_TITLE",(allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_FINISH_TITLE",(allocator<char> *)&nsisPostArguments)
      ;
      nsisPreArguments._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
      cmStrCat<char_const(&)[31],cmValue,char_const(&)[2]>
                ((string *)&cmCPackLog_msg,(char (*) [31])"!define MUI_FINISHPAGE_TITLE \"",
                 (cmValue *)&nsisPreArguments,(char (*) [2])0x70274e);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&fileN_1,"CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE",
                 (allocator<char> *)&nsisPreArguments);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_FINISH_TITLE_3LINES",
               (allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE",
                 (allocator<char> *)&fileN_1);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,
                 "!define MUI_FINISHPAGE_TITLE_3LINES");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_MANIFEST_DPI_AWARE",(allocator<char> *)&fileN_1
              );
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_MANIFEST_DPI_AWARE_CODE",
                 (allocator<char> *)&fileN_1);
      cmCPackGenerator::SetOptionIfNotSet
                (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"ManifestDPIAware true");
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg,"CPACK_NSIS_BRANDING_TEXT",(allocator<char> *)&fileN_1);
    bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg);
    if (bVar6) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nsisPreArguments,"LEFT",(allocator<char> *)&cmCPackLog_msg);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION",
                 (allocator<char> *)&fileN_1);
      bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (!bVar6) {
LAB_0019ef83:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fileN_1,"CPACK_NSIS_BRANDING_TEXT",(allocator<char> *)&nsisCmd);
        nsisPostArguments._M_dataplus._M_p =
             (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
        cmStrCat<char_const(&)[19],std::__cxx11::string&,char_const(&)[3],cmValue,char_const(&)[3]>
                  ((string *)&cmCPackLog_msg,(char (*) [19])"BrandingText /TRIM",&nsisPreArguments,
                   (char (*) [3])0x6d8379,(cmValue *)&nsisPostArguments,(char (*) [3])0x702875);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fileN_1,"CPACK_NSIS_BRANDING_TEXT_CODE",
                   (allocator<char> *)&nsisPostArguments);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&nsisPreArguments);
        goto LAB_0019f044;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION",
                 (allocator<char> *)&fileN_1);
      psVar8 = (string *)
               cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      if (psVar8 == (string *)0x0) {
        psVar8 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&nsisPostArguments,(string *)psVar8);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (nsisPostArguments._M_string_length == 0) {
LAB_0019ef79:
        std::__cxx11::string::~string((string *)&nsisPostArguments);
        goto LAB_0019ef83;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CENTER",(allocator<char> *)&nsisCmd);
      std::__cxx11::string::string<std::allocator<char>>
                (local_750,"LEFT",(allocator<char> *)&output);
      std::__cxx11::string::string<std::allocator<char>>
                (local_730,"RIGHT",(allocator<char> *)&componentDescriptions);
      __l._M_len = 3;
      __l._M_array = (iterator)&cmCPackLog_msg;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&fileN_1,__l,
            (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&retVal,(allocator_type *)&installTypesCode);
      lVar10 = 0x40;
      do {
        std::__cxx11::string::~string((string *)(&cmCPackLog_msg + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&fileN_1,&nsisPostArguments);
      if (cVar11._M_node == (_Base_ptr)&fileN_1._M_string_length) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,
                                 "Unsupported branding text trim position ");
        poVar9 = std::operator<<(poVar9,(string *)&nsisPostArguments);
        std::endl<char,std::char_traits<char>>(poVar9);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0xe3,nsisCmd._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&nsisCmd);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&nsisPreArguments);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fileN_1);
      if (cVar11._M_node != (_Base_ptr)&fileN_1._M_string_length) goto LAB_0019ef79;
      std::__cxx11::string::~string((string *)&nsisPostArguments);
      std::__cxx11::string::~string((string *)&nsisPreArguments);
      uVar16 = 0;
    }
    else {
LAB_0019f044:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_IGNORE_LICENSE_PAGE",
                 (allocator<char> *)&fileN_1);
      bVar6 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (!bVar6) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fileN_1,"CPACK_RESOURCE_FILE_LICENSE",
                   (allocator<char> *)&nsisPostArguments);
        nsisPreArguments._M_dataplus._M_p =
             (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&fileN_1);
        cmStrCat<char_const(&)[32],cmValue,char_const(&)[3]>
                  ((string *)&cmCPackLog_msg,(char (*) [32])"!insertmacro MUI_PAGE_LICENSE \"",
                   (cmValue *)&nsisPreArguments,(char (*) [3])0x702875);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fileN_1,"CPACK_NSIS_LICENSE_PAGE",(allocator<char> *)&nsisPreArguments
                  );
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&fileN_1,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&fileN_1);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
      nsisPreArguments._M_dataplus._M_p = (pointer)&nsisPreArguments.field_2;
      nsisPreArguments._M_string_length = 0;
      nsisPreArguments.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS",
                 (allocator<char> *)&fileN_1);
      cVar12 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (cVar12.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)cVar12.Value);
        init._M_len = 1;
        init._M_array = (iterator)&cmCPackLog_msg;
        cmList::cmList((cmList *)&fileN_1,init);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        sVar4 = fileN_1._M_string_length;
        for (_Var18 = fileN_1._M_dataplus; _Var18._M_p != (pointer)sVar4;
            _Var18._M_p = _Var18._M_p + 0x20) {
          prefix._M_str = "-";
          prefix._M_len = 1;
          str_00._M_str =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var18._M_p)->
               _M_dataplus)._M_p;
          str_00._M_len =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var18._M_p)->
               _M_string_length;
          bVar6 = cmHasPrefix(str_00,prefix);
          if (!bVar6) {
            cmStrCat<std::__cxx11::string&,char_const(&)[2]>
                      ((string *)&cmCPackLog_msg,&nsisPreArguments,(char (*) [2])0x710b9f);
            std::__cxx11::string::operator=((string *)&nsisPreArguments,(string *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          }
          nsisPostArguments._M_dataplus._M_p._0_1_ = 0x20;
          cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char>
                    ((string *)&cmCPackLog_msg,&nsisPreArguments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var18._M_p,(char *)&nsisPostArguments);
          std::__cxx11::string::operator=((string *)&nsisPreArguments,(string *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fileN_1);
      }
      nsisPostArguments._M_dataplus._M_p = (pointer)&nsisPostArguments.field_2;
      nsisPostArguments._M_string_length = 0;
      nsisPostArguments.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS",
                 (allocator<char> *)&fileN_1);
      cVar12 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (cVar12.Value != (string *)0x0) {
        std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)cVar12.Value);
        init_00._M_len = 1;
        init_00._M_array = (iterator)&cmCPackLog_msg;
        cmList::cmList((cmList *)&fileN_1,init_00);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        sVar4 = fileN_1._M_string_length;
        for (_Var18 = fileN_1._M_dataplus; _Var18._M_p != (pointer)sVar4;
            _Var18._M_p = _Var18._M_p + 0x20) {
          prefix_00._M_str = "-";
          prefix_00._M_len = 1;
          str_01._M_str =
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var18._M_p)->
               _M_dataplus)._M_p;
          str_01._M_len =
               ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var18._M_p)->
               _M_string_length;
          bVar6 = cmHasPrefix(str_01,prefix_00);
          if (!bVar6) {
            cmStrCat<std::__cxx11::string&,char_const(&)[2]>
                      ((string *)&cmCPackLog_msg,&nsisPostArguments,(char (*) [2])0x710b9f);
            std::__cxx11::string::operator=((string *)&nsisPostArguments,(string *)&cmCPackLog_msg);
            std::__cxx11::string::~string((string *)&cmCPackLog_msg);
          }
          nsisCmd._M_dataplus._M_p._0_1_ = 0x20;
          cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char>
                    ((string *)&cmCPackLog_msg,&nsisPostArguments,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Var18._M_p,(char *)&nsisCmd);
          std::__cxx11::string::operator=((string *)&nsisPostArguments,(string *)&cmCPackLog_msg);
          std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&fileN_1);
      }
      if ((this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header._M_node_count
          == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_INSTALLATION_TYPES",
                   (allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                   (allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_PAGE_COMPONENTS",
                   (allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_FULL_INSTALL",(allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,
                   "File /r \"${INST_DIR}\\*.*\"");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_COMPONENT_SECTIONS",
                   (allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_COMPONENT_SECTION_LIST",
                   (allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&cmCPackLog_msg,"CPACK_NSIS_SECTION_SELECTED_VARS",
                   (allocator<char> *)&fileN_1);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg,"");
        psVar8 = (string *)&cmCPackLog_msg;
      }
      else {
        fileN_1._M_dataplus._M_p = (pointer)&fileN_1.field_2;
        fileN_1._M_string_length = 0;
        nsisCmd._M_dataplus._M_p = (pointer)&nsisCmd.field_2;
        nsisCmd._M_string_length = 0;
        fileN_1.field_2._M_local_buf[0] = '\0';
        nsisCmd.field_2._M_local_buf[0] = '\0';
        output._M_dataplus._M_p = (pointer)&output.field_2;
        output._M_string_length = 0;
        componentDescriptions._M_dataplus._M_p = (pointer)&componentDescriptions.field_2;
        componentDescriptions._M_string_length = 0;
        output.field_2._M_local_buf[0] = '\0';
        componentDescriptions.field_2._M_local_buf[0] = '\0';
        _retVal = (pointer)&local_4f8;
        local_500 = 0;
        installTypesCode._M_dataplus._M_p = (pointer)&installTypesCode.field_2;
        installTypesCode._M_string_length = 0;
        local_4f8._M_local_buf[0] = '\0';
        installTypesCode.field_2._M_local_buf[0] = '\0';
        defines._M_dataplus._M_p = (pointer)&defines.field_2;
        defines._M_string_length = 0;
        defines.field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        std::vector<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::vector
                  (&installTypes,
                   (this->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                   super__Rb_tree_header._M_node_count,(allocator_type *)&local_a10);
        for (p_Var13 = (this->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 !=
            &(this->super_cmCPackGenerator).InstallationTypes._M_t._M_impl.super__Rb_tree_header;
            p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
          installTypes.
          super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>.
          _M_impl.super__Vector_impl_data._M_start[p_Var13[4]._M_color - _S_black] =
               (cmCPackInstallationType *)(p_Var13 + 2);
        }
        for (ppcVar17 = installTypes.
                        super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppcVar17 !=
            installTypes.
            super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
            ._M_impl.super__Vector_impl_data._M_finish; ppcVar17 = ppcVar17 + 1) {
          std::__cxx11::string::append((char *)&installTypesCode);
          std::__cxx11::string::append((string *)&installTypesCode);
          std::__cxx11::string::append((char *)&installTypesCode);
        }
        for (p_Var14 = (this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.
                       super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var14 !=
            &(this->super_cmCPackGenerator).ComponentGroups._M_t._M_impl.super__Rb_tree_header;
            p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
          if (*(long *)(p_Var14 + 6) == 0) {
            CreateComponentGroupDescription_abi_cxx11_
                      (&local_a10,this,(cmCPackComponentGroup *)(p_Var14 + 2),
                       (ostream *)&cmCPackLog_msg);
            std::__cxx11::string::append((string *)&fileN_1);
            std::__cxx11::string::~string((string *)&local_a10);
          }
          if (p_Var14[4]._M_parent != (_Base_ptr)0x0) {
            std::operator+(&local_3d0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (p_Var14 + 1));
            std::operator+(&local_790,&local_3d0,"} \"");
            std::__cxx11::string::string((string *)&local_1c8,(string *)(p_Var14 + 4));
            TranslateNewlines(&local_490,&local_1c8);
            std::operator+(&local_9a8,&local_790,&local_490);
            std::operator+(&local_a10,&local_9a8,"\"\n");
            std::__cxx11::string::append((string *)&retVal);
            std::__cxx11::string::~string((string *)&local_a10);
            std::__cxx11::string::~string((string *)&local_9a8);
            std::__cxx11::string::~string((string *)&local_490);
            std::__cxx11::string::~string((string *)&local_1c8);
            std::__cxx11::string::~string((string *)&local_790);
            std::__cxx11::string::~string((string *)&local_3d0);
          }
        }
        p_Var14 = (this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        bVar15 = 0;
        while ((_Rb_tree_header *)p_Var14 !=
               &(this->super_cmCPackGenerator).Components._M_t._M_impl.super__Rb_tree_header) {
          bVar7 = bVar15;
          if (p_Var14[9]._M_right != *(_Base_ptr *)(p_Var14 + 10)) {
            bVar7 = *(byte *)&p_Var14[4]._M_parent >> 3;
            if ((bVar15 & 1) != 0) {
              bVar7 = 1;
            }
            if (*(long *)(p_Var14 + 4) == 0) {
              CreateComponentDescription_abi_cxx11_
                        (&local_a10,this,(cmCPackComponent *)(p_Var14 + 2),
                         (ostream *)&cmCPackLog_msg);
              std::__cxx11::string::append((string *)&fileN_1);
              std::__cxx11::string::~string((string *)&local_a10);
            }
            std::__cxx11::string::append((char *)&nsisCmd);
            p_Var13 = p_Var14 + 1;
            std::__cxx11::string::append((string *)&nsisCmd);
            std::__cxx11::string::append((char *)&nsisCmd);
            std::operator+(&local_9a8,"Var ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var13);
            std::operator+(&local_a10,&local_9a8,"_selected\n");
            std::__cxx11::string::append((string *)&output);
            std::__cxx11::string::~string((string *)&local_a10);
            std::__cxx11::string::~string((string *)&local_9a8);
            std::operator+(&local_9a8,"Var ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           p_Var13);
            std::operator+(&local_a10,&local_9a8,"_was_installed\n");
            std::__cxx11::string::append((string *)&output);
            std::__cxx11::string::~string((string *)&local_a10);
            std::__cxx11::string::~string((string *)&local_9a8);
            if (p_Var14[4]._M_right != (_Base_ptr)0x0) {
              std::operator+(&local_3d0,"  !insertmacro MUI_DESCRIPTION_TEXT ${",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             p_Var13);
              std::operator+(&local_790,&local_3d0,"} \"");
              std::__cxx11::string::string((string *)&local_360,(string *)&p_Var14[4]._M_left);
              TranslateNewlines(&local_490,&local_360);
              std::operator+(&local_9a8,&local_790,&local_490);
              std::operator+(&local_a10,&local_9a8,"\"\n");
              std::__cxx11::string::append((string *)&componentDescriptions);
              std::__cxx11::string::~string((string *)&local_a10);
              std::__cxx11::string::~string((string *)&local_9a8);
              std::__cxx11::string::~string((string *)&local_490);
              std::__cxx11::string::~string((string *)&local_360);
              std::__cxx11::string::~string((string *)&local_790);
              std::__cxx11::string::~string((string *)&local_3d0);
            }
          }
          p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
          bVar15 = bVar7;
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)&fileN_1);
        std::__cxx11::string::~string((string *)&local_a10);
        if (local_500 == 0 && componentDescriptions._M_string_length == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a10,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                     (allocator<char> *)&local_9a8);
          cmCPackGenerator::SetOptionIfNotSet
                    (&this->super_cmCPackGenerator,&local_a10,"!define MUI_COMPONENTSPAGE_NODESC");
        }
        else {
          std::operator+(&local_790,"!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n",
                         &componentDescriptions);
          std::operator+(&local_9a8,&local_790,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &retVal);
          std::operator+(&local_a10,&local_9a8,"!insertmacro MUI_FUNCTION_DESCRIPTION_END\n");
          std::__cxx11::string::operator=((string *)&componentDescriptions,(string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_a10);
          std::__cxx11::string::~string((string *)&local_9a8);
          std::__cxx11::string::~string((string *)&local_790);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a10,"CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                     (allocator<char> *)&local_9a8);
          cmCPackGenerator::SetOptionIfNotSet
                    (&this->super_cmCPackGenerator,&local_a10,&componentDescriptions);
        }
        std::__cxx11::string::~string((string *)&local_a10);
        if ((bVar15 & 1) != 0) {
          std::__cxx11::string::append((char *)&defines);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a10,"CPACK_ADD_REMOVE",(allocator<char> *)&local_790);
          local_9a8._M_dataplus._M_p =
               (pointer)cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_a10);
          bVar6 = cmValue::IsOn((cmValue *)&local_9a8);
          std::__cxx11::string::~string((string *)&local_a10);
          if (bVar6) {
            std::__cxx11::string::append((char *)&defines);
          }
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_INSTALLATION_TYPES",
                   (allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_a10,&installTypesCode);
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_PAGE_COMPONENTS",(allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOptionIfNotSet
                  (&this->super_cmCPackGenerator,&local_a10,"!insertmacro MUI_PAGE_COMPONENTS");
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_FULL_INSTALL",(allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_a10,"");
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_COMPONENT_SECTIONS",
                   (allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_a10,&fileN_1);
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_COMPONENT_SECTION_LIST",
                   (allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_a10,&nsisCmd);
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_SECTION_SELECTED_VARS",
                   (allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOptionIfNotSet(&this->super_cmCPackGenerator,&local_a10,&output);
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a10,"CPACK_NSIS_DEFINES",(allocator<char> *)&local_9a8);
        cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_a10,&defines);
        std::__cxx11::string::~string((string *)&local_a10);
        std::_Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>::
        ~_Vector_base(&installTypes.
                       super__Vector_base<cmCPackInstallationType_*,_std::allocator<cmCPackInstallationType_*>_>
                     );
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&defines);
        std::__cxx11::string::~string((string *)&installTypesCode);
        std::__cxx11::string::~string((string *)&retVal);
        std::__cxx11::string::~string((string *)&componentDescriptions);
        std::__cxx11::string::~string((string *)&output);
        std::__cxx11::string::~string((string *)&nsisCmd);
        psVar8 = &fileN_1;
      }
      std::__cxx11::string::~string((string *)psVar8);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
                (this,&nsisInInstallOptions,&nsisInstallOptions,0);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0xc])
                (this,&nsisInFileName,&nsisFileName,0);
      output._M_dataplus._M_p._0_1_ = 0x22;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg,"CPACK_INSTALLER_PROGRAM",
                 (allocator<char> *)&componentDescriptions);
      fileN_1._M_dataplus._M_p =
           (pointer)cmCPackGenerator::GetOption
                              (&this->super_cmCPackGenerator,(string *)&cmCPackLog_msg);
      retVal._0_1_ = 0x22;
      cmStrCat<char,cmValue,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char>
                (&nsisCmd,(char *)&output,(cmValue *)&fileN_1,(char (*) [3])0x711871,
                 &nsisPreArguments,(char (*) [3])0x6d8379,&nsisFileName,(char *)&retVal);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      if (nsisPostArguments._M_string_length != 0) {
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                  ((string *)&cmCPackLog_msg,&nsisCmd,(char (*) [2])0x6f1305,&nsisPostArguments);
        std::__cxx11::string::operator=((string *)&nsisCmd,(string *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
      poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,"Execute: ");
      poVar9 = std::operator<<(poVar9,(string *)&nsisCmd);
      std::endl<char,std::char_traits<char>>(poVar9);
      pcVar2 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar2,2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                      ,0x188,fileN_1._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&fileN_1);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      retVal = 1;
      bVar6 = cmSystemTools::RunSingleCommand
                        (&nsisCmd,&output,&output,&retVal,(char *)0x0,
                         (this->super_cmCPackGenerator).GeneratorVerbose,(cmDuration)0x0);
      bVar19 = retVal != 0;
      if (!bVar6 || bVar19) {
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&cmCPackLog_msg,&tmpFile,false,None);
        poVar9 = std::operator<<((ostream *)&cmCPackLog_msg,"# Run command: ");
        poVar9 = std::operator<<(poVar9,(string *)&nsisCmd);
        poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<(poVar9,"# Output:");
        poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<(poVar9,(string *)&output);
        std::endl<char,std::char_traits<char>>(poVar9);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fileN_1);
        poVar9 = std::operator<<((ostream *)&fileN_1,"Problem running NSIS command: ");
        poVar9 = std::operator<<(poVar9,(string *)&nsisCmd);
        poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
        poVar9 = std::operator<<(poVar9,"Please check ");
        poVar9 = std::operator<<(poVar9,(string *)&tmpFile);
        poVar9 = std::operator<<(poVar9," for errors");
        std::endl<char,std::char_traits<char>>(poVar9);
        pcVar2 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(pcVar2,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/cmCPackNSISGenerator.cxx"
                        ,0x197,componentDescriptions._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&componentDescriptions);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fileN_1);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&cmCPackLog_msg);
      }
      uVar16 = (uint)(bVar6 && !bVar19);
      std::__cxx11::string::~string((string *)&output);
      std::__cxx11::string::~string((string *)&nsisCmd);
      std::__cxx11::string::~string((string *)&nsisPostArguments);
      std::__cxx11::string::~string((string *)&nsisPreArguments);
    }
    std::__cxx11::string::~string((string *)&installerHeaderImage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dstr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&dirs);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
    std::__cxx11::string::~string((string *)&nsisInstallOptions);
    std::__cxx11::string::~string((string *)&tmpFile);
    std::__cxx11::string::~string((string *)&nsisFileName);
  }
  std::__cxx11::string::~string((string *)&nsisInInstallOptions);
LAB_001a020a:
  std::__cxx11::string::~string((string *)&nsisInFileName);
  return uVar16;
}

Assistant:

int cmCPackNSISGenerator::PackageFiles()
{
  // TODO: Fix nsis to force out file name

  std::string nsisInFileName = this->FindTemplate("NSIS.template.in");
  if (nsisInFileName.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer template file."
                    << std::endl);
    return false;
  }
  std::string nsisInInstallOptions =
    this->FindTemplate("NSIS.InstallOptions.ini.in");
  if (nsisInInstallOptions.empty()) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "CPack error: Could not find NSIS installer options file."
                    << std::endl);
    return false;
  }

  std::string nsisFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  std::string tmpFile = cmStrCat(nsisFileName, "/NSISOutput.log");
  std::string nsisInstallOptions = nsisFileName + "/NSIS.InstallOptions.ini";
  nsisFileName += "/project.nsi";
  std::ostringstream str;
  for (std::string const& file : this->files) {
    std::string outputDir = "$INSTDIR";
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, file);
    if (!this->Components.empty()) {
      const std::string::size_type pos = fileN.find('/');

      // Use the custom component install directory if we have one
      if (pos != std::string::npos) {
        auto componentName = cm::string_view(fileN).substr(0, pos);
        outputDir = this->CustomComponentInstallDirectory(componentName);
      } else {
        outputDir = this->CustomComponentInstallDirectory(fileN);
      }

      // Strip off the component part of the path.
      fileN = fileN.substr(pos + 1);
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    str << "  Delete \"" << outputDir << "\\" << fileN << "\"" << std::endl;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Files: " << str.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_FILES", str.str());
  std::vector<std::string> dirs;
  this->GetListOfSubdirectories(this->toplevel.c_str(), dirs);
  std::ostringstream dstr;
  for (std::string const& dir : dirs) {
    std::string componentName;
    std::string fileN = cmSystemTools::RelativePath(this->toplevel, dir);
    if (fileN.empty()) {
      continue;
    }
    if (!this->Components.empty()) {
      // If this is a component installation, strip off the component
      // part of the path.
      std::string::size_type slash = fileN.find('/');
      if (slash != std::string::npos) {
        // If this is a component installation, determine which component it
        // is.
        componentName = fileN.substr(0, slash);

        // Strip off the component part of the path.
        fileN.erase(0, slash + 1);
      }
    }
    std::replace(fileN.begin(), fileN.end(), '/', '\\');

    const std::string componentOutputDir =
      this->CustomComponentInstallDirectory(componentName);

    dstr << "  RMDir \"" << componentOutputDir << "\\" << fileN << "\""
         << std::endl;
    if (!componentName.empty()) {
      this->Components[componentName].Directories.push_back(std::move(fileN));
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "Uninstall Dirs: " << dstr.str() << std::endl);
  this->SetOptionIfNotSet("CPACK_NSIS_DELETE_DIRECTORIES", dstr.str());

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Configure file: " << nsisInFileName << " to " << nsisFileName
                                   << std::endl);
  if (this->IsSet("CPACK_NSIS_MUI_ICON") ||
      this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
    std::string installerIconCode;
    if (this->IsSet("CPACK_NSIS_MUI_ICON")) {
      installerIconCode += cmStrCat(
        "!define MUI_ICON \"", this->GetOption("CPACK_NSIS_MUI_ICON"), "\"\n");
    }
    if (this->IsSet("CPACK_NSIS_MUI_UNIICON")) {
      installerIconCode +=
        cmStrCat("!define MUI_UNICON \"",
                 this->GetOption("CPACK_NSIS_MUI_UNIICON"), "\"\n");
    }
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_ICON_CODE",
                            installerIconCode.c_str());
  }
  std::string installerHeaderImage;
  if (this->IsSet("CPACK_NSIS_MUI_HEADERIMAGE")) {
    installerHeaderImage = *this->GetOption("CPACK_NSIS_MUI_HEADERIMAGE");
  } else if (this->IsSet("CPACK_PACKAGE_ICON")) {
    installerHeaderImage = *this->GetOption("CPACK_PACKAGE_ICON");
  }
  if (!installerHeaderImage.empty()) {
    std::string installerIconCode = cmStrCat(
      "!define MUI_HEADERIMAGE_BITMAP \"", installerHeaderImage, "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_ICON_CODE",
                            installerIconCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_WELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_WELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_WELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP")) {
    std::string installerBitmapCode = cmStrCat(
      "!define MUI_UNWELCOMEFINISHPAGE_BITMAP \"",
      this->GetOption("CPACK_NSIS_MUI_UNWELCOMEFINISHPAGE_BITMAP"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_UNWELCOMEFINISH_CODE",
                            installerBitmapCode);
  }

  if (this->IsSet("CPACK_NSIS_MUI_FINISHPAGE_RUN")) {
    std::string installerRunCode =
      cmStrCat("!define MUI_FINISHPAGE_RUN \"$INSTDIR\\",
               this->GetOption("CPACK_NSIS_EXECUTABLES_DIRECTORY"), '\\',
               this->GetOption("CPACK_NSIS_MUI_FINISHPAGE_RUN"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_FINISHPAGE_RUN_CODE",
                            installerRunCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE")) {
    std::string welcomeTitleCode =
      cmStrCat("!define MUI_WELCOMEPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_WELCOME_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_CODE",
                            welcomeTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_WELCOME_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_WELCOME_TITLE_3LINES_CODE",
                            "!define MUI_WELCOMEPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE")) {
    std::string finishTitleCode =
      cmStrCat("!define MUI_FINISHPAGE_TITLE \"",
               this->GetOption("CPACK_NSIS_FINISH_TITLE"), "\"");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_CODE",
                            finishTitleCode);
  }

  if (this->IsSet("CPACK_NSIS_FINISH_TITLE_3LINES")) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_FINISH_TITLE_3LINES_CODE",
                            "!define MUI_FINISHPAGE_TITLE_3LINES");
  }

  if (this->IsSet("CPACK_NSIS_MANIFEST_DPI_AWARE")) {
    this->SetOptionIfNotSet("CPACK_NSIS_MANIFEST_DPI_AWARE_CODE",
                            "ManifestDPIAware true");
  }

  if (this->IsSet("CPACK_NSIS_BRANDING_TEXT")) {
    // Default position to LEFT
    std::string brandingTextPosition = "LEFT";
    if (this->IsSet("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION")) {
      std::string wantedPosition =
        this->GetOption("CPACK_NSIS_BRANDING_TEXT_TRIM_POSITION");
      if (!wantedPosition.empty()) {
        const std::set<std::string> possiblePositions{ "CENTER", "LEFT",
                                                       "RIGHT" };
        if (possiblePositions.find(wantedPosition) ==
            possiblePositions.end()) {
          cmCPackLogger(cmCPackLog::LOG_ERROR,
                        "Unsupported branding text trim position "
                          << wantedPosition << std::endl);
          return false;
        }
        brandingTextPosition = wantedPosition;
      }
    }
    std::string brandingTextCode =
      cmStrCat("BrandingText /TRIM", brandingTextPosition, " \"",
               this->GetOption("CPACK_NSIS_BRANDING_TEXT"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_BRANDING_TEXT_CODE", brandingTextCode);
  }

  if (!this->IsSet("CPACK_NSIS_IGNORE_LICENSE_PAGE")) {
    std::string licenceCode =
      cmStrCat("!insertmacro MUI_PAGE_LICENSE \"",
               this->GetOption("CPACK_RESOURCE_FILE_LICENSE"), "\"\n");
    this->SetOptionIfNotSet("CPACK_NSIS_LICENSE_PAGE", licenceCode);
  }

  std::string nsisPreArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_PRE_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };

    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPreArguments = cmStrCat(nsisPreArguments, NSIS_OPT);
      }
      nsisPreArguments = cmStrCat(nsisPreArguments, arg, ' ');
    }
  }

  std::string nsisPostArguments;
  if (cmValue nsisArguments =
        this->GetOption("CPACK_NSIS_EXECUTABLE_POST_ARGUMENTS")) {
    cmList expandedArguments{ nsisArguments };
    for (auto& arg : expandedArguments) {
      if (!cmHasPrefix(arg, NSIS_OPT)) {
        nsisPostArguments = cmStrCat(nsisPostArguments, NSIS_OPT);
      }
      nsisPostArguments = cmStrCat(nsisPostArguments, arg, ' ');
    }
  }

  // Setup all of the component sections
  if (this->Components.empty()) {
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", "");
    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC", "");
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL",
                            R"(File /r "${INST_DIR}\*.*")");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", "");
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS", "");
  } else {
    std::string componentCode;
    std::string sectionList;
    std::string selectedVarsList;
    std::string componentDescriptions;
    std::string groupDescriptions;
    std::string installTypesCode;
    std::string defines;
    std::ostringstream macrosOut;
    bool anyDownloadedComponents = false;

    // Create installation types. The order is significant, so we first fill
    // in a vector based on the indices, and print them in that order.
    std::vector<cmCPackInstallationType*> installTypes(
      this->InstallationTypes.size());
    for (auto& installType : this->InstallationTypes) {
      installTypes[installType.second.Index - 1] = &installType.second;
    }
    for (cmCPackInstallationType* installType : installTypes) {
      installTypesCode += "InstType \"";
      installTypesCode += installType->DisplayName;
      installTypesCode += "\"\n";
    }

    // Create installation groups first
    for (auto& group : this->ComponentGroups) {
      if (group.second.ParentGroup == nullptr) {
        componentCode +=
          this->CreateComponentGroupDescription(&group.second, macrosOut);
      }

      // Add the group description, if any.
      if (!group.second.Description.empty()) {
        groupDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          group.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(group.second.Description) +
          "\"\n";
      }
    }

    // Create the remaining components, which aren't associated with groups.
    for (auto& comp : this->Components) {
      if (comp.second.Files.empty()) {
        // NSIS cannot cope with components that have no files.
        continue;
      }

      anyDownloadedComponents =
        anyDownloadedComponents || comp.second.IsDownloaded;

      if (!comp.second.Group) {
        componentCode +=
          this->CreateComponentDescription(&comp.second, macrosOut);
      }

      // Add this component to the various section lists.
      sectionList += R"(  !insertmacro "${MacroName}" ")";
      sectionList += comp.first;
      sectionList += "\"\n";
      selectedVarsList += "Var " + comp.first + "_selected\n";
      selectedVarsList += "Var " + comp.first + "_was_installed\n";

      // Add the component description, if any.
      if (!comp.second.Description.empty()) {
        componentDescriptions += "  !insertmacro MUI_DESCRIPTION_TEXT ${" +
          comp.first + "} \"" +
          cmCPackNSISGenerator::TranslateNewlines(comp.second.Description) +
          "\"\n";
      }
    }

    componentCode += macrosOut.str();

    if (componentDescriptions.empty() && groupDescriptions.empty()) {
      // Turn off the "Description" box
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              "!define MUI_COMPONENTSPAGE_NODESC");
    } else {
      componentDescriptions = "!insertmacro MUI_FUNCTION_DESCRIPTION_BEGIN\n" +
        componentDescriptions + groupDescriptions +
        "!insertmacro MUI_FUNCTION_DESCRIPTION_END\n";
      this->SetOptionIfNotSet("CPACK_NSIS_INSTALLER_MUI_COMPONENTS_DESC",
                              componentDescriptions);
    }

    if (anyDownloadedComponents) {
      defines += "!define CPACK_USES_DOWNLOAD\n";
      if (this->GetOption("CPACK_ADD_REMOVE").IsOn()) {
        defines += "!define CPACK_NSIS_ADD_REMOVE\n";
      }
    }

    this->SetOptionIfNotSet("CPACK_NSIS_INSTALLATION_TYPES", installTypesCode);
    this->SetOptionIfNotSet("CPACK_NSIS_PAGE_COMPONENTS",
                            "!insertmacro MUI_PAGE_COMPONENTS");
    this->SetOptionIfNotSet("CPACK_NSIS_FULL_INSTALL", "");
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTIONS", componentCode);
    this->SetOptionIfNotSet("CPACK_NSIS_COMPONENT_SECTION_LIST", sectionList);
    this->SetOptionIfNotSet("CPACK_NSIS_SECTION_SELECTED_VARS",
                            selectedVarsList);
    this->SetOption("CPACK_NSIS_DEFINES", defines);
  }

  this->ConfigureFile(nsisInInstallOptions, nsisInstallOptions);
  this->ConfigureFile(nsisInFileName, nsisFileName);
  std::string nsisCmd =
    cmStrCat('"', this->GetOption("CPACK_INSTALLER_PROGRAM"), "\" ",
             nsisPreArguments, " \"", nsisFileName, '"');
  if (!nsisPostArguments.empty()) {
    nsisCmd = cmStrCat(nsisCmd, " ", nsisPostArguments);
  }
  cmCPackLogger(cmCPackLog::LOG_VERBOSE, "Execute: " << nsisCmd << std::endl);
  std::string output;
  int retVal = 1;
  bool res = cmSystemTools::RunSingleCommand(
    nsisCmd, &output, &output, &retVal, nullptr, this->GeneratorVerbose,
    cmDuration::zero());
  if (!res || retVal) {
    cmGeneratedFileStream ofs(tmpFile);
    ofs << "# Run command: " << nsisCmd << std::endl
        << "# Output:" << std::endl
        << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem running NSIS command: " << nsisCmd << std::endl
                                                   << "Please check "
                                                   << tmpFile << " for errors"
                                                   << std::endl);
    return 0;
  }
  return 1;
}